

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandCleanup(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint local_48;
  uint local_44;
  int fVerbose;
  int fCleanupPos;
  int fCleanupPis;
  int c;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  fVerbose = 1;
  local_44 = 1;
  local_48 = 1;
  Extra_UtilGetoptReset();
LAB_0026669c:
  iVar1 = Extra_UtilGetopt(argc,argv,"iovh");
  if (iVar1 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar1 = Abc_NtkIsStrash(pNtk_00);
      if (iVar1 == 0) {
        Abc_NtkCleanup(pNtk_00,local_48);
        _fCleanupPis = Abc_NtkDup(pNtk_00);
      }
      else if ((fVerbose == 0) && (local_44 == 0)) {
        Abc_Print(-1,"Cleanup for PIs and POs is not enabled.\n");
        _fCleanupPis = Abc_NtkDup(pNtk_00);
      }
      else {
        _fCleanupPis = Abc_NtkDarCleanupAig(pNtk_00,fVerbose,local_44,local_48);
      }
      if (_fCleanupPis == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Cleanup has failed.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        Abc_FrameReplaceCurrentNetwork(pAbc,_fCleanupPis);
        pAbc_local._4_4_ = 0;
      }
    }
    return pAbc_local._4_4_;
  }
  switch(iVar1) {
  case 0x68:
    break;
  case 0x69:
    fVerbose = fVerbose ^ 1;
    goto LAB_0026669c;
  default:
    break;
  case 0x6f:
    local_44 = local_44 ^ 1;
    goto LAB_0026669c;
  case 0x76:
    goto switchD_002666da_caseD_76;
  }
  Abc_Print(-2,"usage: cleanup [-iovh]\n");
  Abc_Print(-2,"\t        for logic networks, removes dangling combinatinal logic\n");
  Abc_Print(-2,"\t        for AIGs, removes PIs w/o fanout and POs driven by const-0\n");
  pcVar2 = "no";
  if (fVerbose != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-i    : toggles removing PIs without fanout [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (local_44 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-o    : toggles removing POs with const-0 drivers [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (local_48 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v    : print verbose information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
switchD_002666da_caseD_76:
  local_48 = local_48 ^ 1;
  goto LAB_0026669c;
}

Assistant:

int Abc_CommandCleanup( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int fCleanupPis;
    int fCleanupPos;
    int fVerbose;

    extern Abc_Ntk_t * Abc_NtkDarCleanupAig( Abc_Ntk_t * pNtk, int fCleanupPis, int fCleanupPos, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    fCleanupPis = 1;
    fCleanupPos = 1;
    fVerbose    = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "iovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'i':
            fCleanupPis ^= 1;
            break;
        case 'o':
            fCleanupPos ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsStrash(pNtk) )
    {
        if ( !fCleanupPis && !fCleanupPos )
        {
            Abc_Print( -1, "Cleanup for PIs and POs is not enabled.\n" );
            pNtkRes = Abc_NtkDup( pNtk );
        }
        else
            pNtkRes = Abc_NtkDarCleanupAig( pNtk, fCleanupPis, fCleanupPos, fVerbose );
    }
    else
    {
        Abc_NtkCleanup( pNtk, fVerbose );
        pNtkRes = Abc_NtkDup( pNtk );
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Cleanup has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: cleanup [-iovh]\n" );
    Abc_Print( -2, "\t        for logic networks, removes dangling combinatinal logic\n" );
    Abc_Print( -2, "\t        for AIGs, removes PIs w/o fanout and POs driven by const-0\n" );
    Abc_Print( -2, "\t-i    : toggles removing PIs without fanout [default = %s]\n", fCleanupPis? "yes": "no" );
    Abc_Print( -2, "\t-o    : toggles removing POs with const-0 drivers [default = %s]\n", fCleanupPos? "yes": "no" );
    Abc_Print( -2, "\t-v    : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}